

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapTypes.cpp
# Opt level: O3

void TTD::NSSnapType::EmitSnapHandler
               (SnapHandler *snapHandler,FileWriter *writer,Separator separator)

{
  SnapEntryDataKindTag SVar1;
  SnapAttributeTag SVar2;
  undefined7 in_register_00000011;
  ulong uVar3;
  
  (*writer->_vptr_FileWriter[6])(writer,CONCAT71(in_register_00000011,separator) & 0xffffffff);
  FileWriter::WriteAddr(writer,handlerId,snapHandler->HandlerId,NoSeparator);
  FileWriter::WriteUInt32(writer,extensibleFlag,(uint)snapHandler->IsExtensibleFlag,CommaSeparator);
  FileWriter::WriteUInt32(writer,inlineSlotCapacity,snapHandler->InlineSlotCapacity,CommaSeparator);
  FileWriter::WriteUInt32(writer,totalSlotCapacity,snapHandler->TotalSlotCapacity,CommaSeparator);
  FileWriter::WriteLengthValue(writer,snapHandler->MaxPropertyIndex,CommaSeparator);
  if (snapHandler->MaxPropertyIndex != 0) {
    FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
    (*writer->_vptr_FileWriter[8])(writer,1);
    if (snapHandler->MaxPropertyIndex != 0) {
      uVar3 = 0;
      do {
        (*writer->_vptr_FileWriter[6])(writer,(ulong)(3 - (uVar3 == 0)));
        FileWriter::WriteUInt32
                  (writer,propertyId,snapHandler->PropertyInfoArray[uVar3].PropertyRecordId,
                   NoSeparator);
        SVar1 = snapHandler->PropertyInfoArray[uVar3].DataKind;
        (*writer->_vptr_FileWriter[3])(writer,0x1c,1);
        (*writer->_vptr_FileWriter[0x14])(writer,(ulong)SVar1,0);
        SVar2 = snapHandler->PropertyInfoArray[uVar3].AttributeInfo;
        (*writer->_vptr_FileWriter[3])(writer,0x1d,1);
        (*writer->_vptr_FileWriter[0x14])(writer,(ulong)SVar2,0);
        (*writer->_vptr_FileWriter[7])(writer,0);
        uVar3 = uVar3 + 1;
      } while (uVar3 < snapHandler->MaxPropertyIndex);
    }
    (*writer->_vptr_FileWriter[8])(writer,0xffffffff);
    (*writer->_vptr_FileWriter[5])(writer,2);
  }
  (*writer->_vptr_FileWriter[7])(writer,0);
  return;
}

Assistant:

void EmitSnapHandler(const SnapHandler* snapHandler, FileWriter* writer, NSTokens::Separator separator)
        {
            writer->WriteRecordStart(separator);

            writer->WriteAddr(NSTokens::Key::handlerId, snapHandler->HandlerId);

            writer->WriteUInt32(NSTokens::Key::extensibleFlag, snapHandler->IsExtensibleFlag, NSTokens::Separator::CommaSeparator);

            writer->WriteUInt32(NSTokens::Key::inlineSlotCapacity, snapHandler->InlineSlotCapacity, NSTokens::Separator::CommaSeparator);
            writer->WriteUInt32(NSTokens::Key::totalSlotCapacity, snapHandler->TotalSlotCapacity, NSTokens::Separator::CommaSeparator);

            writer->WriteLengthValue(snapHandler->MaxPropertyIndex, NSTokens::Separator::CommaSeparator);

            if(snapHandler->MaxPropertyIndex > 0)
            {
                writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
                writer->AdjustIndent(1);
                for(uint32 i = 0; i < snapHandler->MaxPropertyIndex; ++i)
                {
                    writer->WriteRecordStart(i != 0 ? NSTokens::Separator::CommaAndBigSpaceSeparator : NSTokens::Separator::BigSpaceSeparator);
                    writer->WriteUInt32(NSTokens::Key::propertyId, snapHandler->PropertyInfoArray[i].PropertyRecordId);
                    writer->WriteTag<SnapEntryDataKindTag>(NSTokens::Key::dataKindTag, snapHandler->PropertyInfoArray[i].DataKind, NSTokens::Separator::CommaSeparator);
                    writer->WriteTag<SnapAttributeTag>(NSTokens::Key::attributeTag, snapHandler->PropertyInfoArray[i].AttributeInfo, NSTokens::Separator::CommaSeparator);
                    writer->WriteRecordEnd();
                }
                writer->AdjustIndent(-1);
                writer->WriteSequenceEnd(NSTokens::Separator::BigSpaceSeparator);
            }

            writer->WriteRecordEnd();
        }